

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_cache_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::NameCacheTests_test_names_Test::~NameCacheTests_test_names_Test
          (NameCacheTests_test_names_Test *this)

{
  NameCacheTests::~NameCacheTests(&this->super_NameCacheTests);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(NameCacheTests, test_names)
{
    name_cache_.NextID("Test");
    name_cache_.NextID("Test2");
    name_cache_.NextID("Test2");
    name_cache_.LastID("Test3");
    name_cache_.NextID("Test");
    std::set<std::string> expected = {"Test", "Test2"};
    EXPECT_EQ(expected, name_cache_.Names());
}